

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall Compiler::compile(Compiler *this)

{
  Parser *this_00;
  _Alloc_hider _Var1;
  size_type sVar2;
  ASTNode *root;
  STGV *this_01;
  TCV *this_02;
  CGV *this_03;
  string visualizerCommand;
  string moonCommand;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = this->parser;
  std::__cxx11::string::string((string *)&local_48,"START",(allocator *)&visualizerCommand);
  Syntax::Parser::parse(this_00,&local_48,false);
  std::__cxx11::string::~string((string *)&local_48);
  AST::ASTBuilder::visualize(this->parser->AST_Builder);
  root = AST::ASTBuilder::getRoot(this->parser->AST_Builder);
  this_01 = (STGV *)operator_new(0x60);
  STGV::STGV(this_01,root);
  this->symTabGenerator = this_01;
  STGV::getErrors_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&visualizerCommand,this_01);
  writeSymTabErrors(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&visualizerCommand);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&visualizerCommand);
  STGV::getWarnings_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&visualizerCommand,this->symTabGenerator);
  writeSymTabWarnings(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&visualizerCommand);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&visualizerCommand);
  writeSymTab(this);
  STGV::getErrors_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&visualizerCommand,this->symTabGenerator);
  sVar2 = visualizerCommand._M_string_length;
  _Var1 = visualizerCommand._M_dataplus;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&visualizerCommand);
  if (_Var1._M_p == (pointer)sVar2) {
    this_02 = (TCV *)operator_new(0x98);
    TCV::TCV(this_02,root,this->symTabGenerator);
    this->typeChecker = this_02;
    TCV::getErrors_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&visualizerCommand,this_02);
    writeTypeCheckingErrors
              (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&visualizerCommand);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&visualizerCommand);
    TCV::getErrors_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&visualizerCommand,this->typeChecker);
    _Var1 = visualizerCommand._M_dataplus;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&visualizerCommand);
    if (_Var1._M_p == (pointer)visualizerCommand._M_string_length) {
      this_03 = (CGV *)operator_new(0x98);
      CGV::CGV(this_03,root,this->symTabGenerator->symbolTable);
      this->codeGenerator = this_03;
      writeMoonOutput(this);
      std::__cxx11::string::string
                ((string *)&visualizerCommand,"dot -Tpng TreeContent.gv -o TreeContent.png",
                 (allocator *)&moonCommand);
      extractFileName_abi_cxx11_(&local_a8,this);
      std::operator+(&local_88,"Moon/moon Moon/Generated/",&local_a8);
      std::operator+(&local_68,&local_88,".m");
      std::operator+(&moonCommand,&local_68," Moon/util.m");
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      system(visualizerCommand._M_dataplus._M_p);
      system(moonCommand._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&moonCommand);
      std::__cxx11::string::~string((string *)&visualizerCommand);
    }
  }
  return;
}

Assistant:

void Compiler::compile() {
    parser->parse("START");
    parser->AST_Builder->visualize();

    AST::ASTNode *root = parser->AST_Builder->getRoot();
    symTabGenerator = new STGV(root);
    writeSymTabErrors(symTabGenerator->getErrors());
    writeSymTabWarnings(symTabGenerator->getWarnings());
    writeSymTab();
    if (!symTabGenerator->getErrors().empty()) return;

    typeChecker = new TCV(root, symTabGenerator);
    writeTypeCheckingErrors(typeChecker->getErrors());

    if (!typeChecker->getErrors().empty()) return;

    codeGenerator = new CGV(root, symTabGenerator->symbolTable);
    writeMoonOutput();

    std::string visualizerCommand = "dot -Tpng TreeContent.gv -o TreeContent.png";
    std::string moonCommand = "Moon/moon Moon/Generated/" + extractFileName() + ".m" + " Moon/util.m";

    system(visualizerCommand.c_str());
    system(moonCommand.c_str());
}